

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
pdqsort_detail::
partition_right<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_16_2_fd512ddf comp)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __b;
  bool bVar1;
  undefined1 uVar2;
  reference piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var4;
  int *in_RSI;
  int *in_RDI;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> pivot_pos;
  bool already_partitioned;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  T pivot;
  undefined4 in_stack_ffffffffffffff68;
  int iVar6;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  byte in_stack_ffffffffffffff7f;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  int *local_68;
  undefined8 in_stack_ffffffffffffffa0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  int local_34;
  int *local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18 [3];
  
  local_20 = in_RSI;
  local_18[0]._M_current = in_RDI;
  piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (local_18);
  local_34 = *piVar3;
  local_40._M_current = local_18[0]._M_current;
  local_48._M_current = local_20;
  do {
    p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator++(&local_40);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*(p_Var4);
    bVar1 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                      ((anon_class_16_2_fd512ddf *)
                       CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                       (HighsInt)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                       (HighsInt)in_stack_ffffffffffffffa0);
  } while (bVar1);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             (difference_type)in_stack_ffffffffffffff70._M_current);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff70._M_current,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (bVar1) {
    do {
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff70._M_current,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      in_stack_ffffffffffffff7f = 0;
      if (bVar1) {
        p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator--(&local_48);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  (p_Var4);
        bVar1 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                          ((anon_class_16_2_fd512ddf *)
                           CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                           (HighsInt)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                           (HighsInt)in_stack_ffffffffffffffa0);
        in_stack_ffffffffffffff7f = bVar1 ^ 0xff;
      }
    } while ((in_stack_ffffffffffffff7f & 1) != 0);
  }
  else {
    do {
      p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator--(&local_48);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (p_Var4);
      bVar1 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                        ((anon_class_16_2_fd512ddf *)
                         CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                         (HighsInt)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                         (HighsInt)in_stack_ffffffffffffffa0);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  uVar2 = __gnu_cxx::operator>=
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff70._M_current,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  while (bVar1 = __gnu_cxx::operator<
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_ffffffffffffff70._M_current,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)), bVar1) {
    local_68 = local_48._M_current;
    __b._M_current._4_4_ = in_stack_ffffffffffffff6c;
    __b._M_current._0_4_ = in_stack_ffffffffffffff68;
    _Var8._M_current = local_40._M_current;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (in_stack_ffffffffffffff70,__b);
    do {
      p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator++(&local_40);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (p_Var4);
      bVar1 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                        ((anon_class_16_2_fd512ddf *)CONCAT17(uVar2,in_stack_ffffffffffffffa8),
                         (HighsInt)((ulong)_Var8._M_current >> 0x20),(HighsInt)_Var8._M_current);
    } while (bVar1);
    do {
      p_Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator--(&local_48);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (p_Var4);
      bVar1 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                        ((anon_class_16_2_fd512ddf *)CONCAT17(uVar2,in_stack_ffffffffffffffa8),
                         (HighsInt)((ulong)_Var8._M_current >> 0x20),(HighsInt)_Var8._M_current);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_70 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                        in_stack_ffffffffffffff70._M_current);
  p_Var4 = &local_70;
  piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (p_Var4);
  iVar6 = *piVar3;
  piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (local_18);
  *piVar3 = iVar6;
  iVar7 = local_34;
  piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (p_Var4);
  *piVar3 = iVar7;
  pVar5 = std::
          make_pair<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>&,bool&>
                    (p_Var4,(bool *)CONCAT44(iVar7,iVar6));
  return pVar5;
}

Assistant:

inline std::pair<Iter, bool> partition_right(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        
        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));

        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        
        // Keep swapping pairs of elements that are on the wrong side of the pivot. Previously
        // swapped pairs guard the searches, which is why the first iteration is special-cased
        // above.
        while (first < last) {
            std::iter_swap(first, last);
            while (comp(*++first, pivot));
            while (!comp(*--last, pivot));
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }